

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

Processor * __thiscall soul::RewritingASTVisitor::visit(RewritingASTVisitor *this,Processor *p)

{
  Processor *p_local;
  RewritingASTVisitor *this_local;
  
  visitArray<std::vector<soul::pool_ref<soul::AST::ASTObject>,std::allocator<soul::pool_ref<soul::AST::ASTObject>>>>
            (this,&(p->super_ProcessorBase).super_ModuleBase.specialisationParams);
  visitArray<std::vector<soul::pool_ref<soul::AST::EndpointDeclaration>,std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>>>>
            (this,&(p->super_ProcessorBase).endpoints);
  visitArray<std::vector<soul::pool_ref<soul::AST::StructDeclaration>,std::allocator<soul::pool_ref<soul::AST::StructDeclaration>>>>
            (this,&(p->super_ProcessorBase).super_ModuleBase.structures);
  visitArray<std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>>>>
            (this,&p->stateVariables);
  replaceArray<std::vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>>
            (this,&p->functions);
  replaceExpression(this,&p->latency);
  visitArray<std::vector<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>>>>
            (this,&(p->super_ProcessorBase).super_ModuleBase.namespaceAliases);
  visitArray<std::vector<soul::pool_ref<soul::AST::StaticAssertion>,std::allocator<soul::pool_ref<soul::AST::StaticAssertion>>>>
            (this,&(p->super_ProcessorBase).super_ModuleBase.staticAssertions);
  return p;
}

Assistant:

virtual AST::Processor& visit (AST::Processor& p)
    {
        visitArray        (p.specialisationParams);
        visitArray        (p.endpoints);
        visitArray        (p.structures);
        visitArray        (p.stateVariables);
        replaceArray      (p.functions);
        replaceExpression (p.latency);
        visitArray        (p.namespaceAliases);
        visitArray        (p.staticAssertions);

        return p;
    }